

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cd_hull.cpp
# Opt level: O2

float3x3 * ConvexDecomposition::operator+(float3x3 *__return_storage_ptr__,float3x3 *a,float3x3 *b)

{
  undefined8 uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined8 extraout_XMM0_Qb_01;
  float3 fVar5;
  float3 fVar6;
  float3 fVar7;
  
  fVar5 = operator+(&a->x,&b->x);
  fVar6 = operator+(&a->y,&b->y);
  fVar7 = operator+(&a->z,&b->z);
  auVar4._8_8_ = extraout_XMM0_Qb;
  auVar4._0_8_ = fVar5._0_8_;
  auVar3._8_8_ = extraout_XMM0_Qb_00;
  auVar3._0_8_ = fVar6._0_8_;
  uVar1 = vmovlps_avx(auVar4);
  (__return_storage_ptr__->x).x = (float)(int)uVar1;
  (__return_storage_ptr__->x).y = (float)(int)((ulong)uVar1 >> 0x20);
  (__return_storage_ptr__->x).z = fVar5.z;
  uVar1 = vmovlps_avx(auVar3);
  (__return_storage_ptr__->y).x = (float)(int)uVar1;
  (__return_storage_ptr__->y).y = (float)(int)((ulong)uVar1 >> 0x20);
  (__return_storage_ptr__->y).z = fVar6.z;
  auVar2._8_8_ = extraout_XMM0_Qb_01;
  auVar2._0_8_ = fVar7._0_8_;
  uVar1 = vmovlps_avx(auVar2);
  (__return_storage_ptr__->z).x = (float)(int)uVar1;
  (__return_storage_ptr__->z).y = (float)(int)((ulong)uVar1 >> 0x20);
  (__return_storage_ptr__->z).z = fVar7.z;
  return __return_storage_ptr__;
}

Assistant:

float3x3 operator+( const float3x3& a, const float3x3& b )
{
	return float3x3(a.x+b.x, a.y+b.y, a.z+b.z);
}